

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O1

char * zt_cstr_dirname(char *npath,size_t len,char *path)

{
  int iVar1;
  size_t sVar2;
  ssize_t sVar3;
  long j;
  
  memset(npath,0,len);
  sVar2 = strlen(path);
  iVar1 = strcmp(path + (sVar2 - 1),"/");
  sVar3 = zt_cstr_rfind(path,0,-1 - (ulong)(iVar1 == 0),"/");
  if (sVar3 == -1) {
    path = ".";
    j = -1;
  }
  else {
    j = sVar3 + -1;
  }
  zt_cstr_copy(path,0,j,npath,len);
  return npath;
}

Assistant:

char *
zt_cstr_dirname(char *npath, size_t len, const char *path) {
    ssize_t    end    = -1;
    ssize_t    ps_len = 0;

    zt_assert(npath);
    zt_assert(path);

    memset(npath, '\0', len);

    /* if the end of the path is the PATH_SEPERATOR then skip over it */
    ps_len = strlen(PATH_SEPERATOR);
    if (strcmp(&path[strlen(path) - ps_len], PATH_SEPERATOR) == 0) {
        end = end - ps_len;
    }

    if ((end = zt_cstr_rfind(path, 0, end, PATH_SEPERATOR)) == -1) {
        /* there is no path seperator */
        zt_cstr_copy(".", 0, -1, npath, len);
        return npath;
    } else {
        end = end - 1;
    }

    zt_cstr_copy(path, 0, end, npath, len);
    return npath;
}